

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O2

void __thiscall ArgumentParser::Instance::Consume(Instance *this,size_t pos,string_view arg)

{
  ActionMap *pAVar1;
  char *pcVar2;
  Continue CVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = arg._M_str;
  local_40._M_len = arg._M_len;
  cVar4 = KeywordActionMap::Find(&this->Bindings->Keywords,arg);
  pAVar1 = this->Bindings;
  if (cVar4._M_current !=
      (pAVar1->Keywords).
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FinishKeyword(this);
    pcVar2 = ((cVar4._M_current)->first)._M_str;
    (this->Keyword)._M_len = ((cVar4._M_current)->first)._M_len;
    (this->Keyword)._M_str = pcVar2;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    if ((this->Bindings->ParsedKeyword).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::
      function<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()(&this->Bindings->ParsedKeyword,this,(cVar4._M_current)->first);
    }
    std::function<void_(ArgumentParser::Instance_&)>::operator()(&(cVar4._M_current)->second,this);
    return;
  }
  if ((this->KeywordValueFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
    if (this->DoneWithPositional == false) {
      cVar5 = PositionActionMap::Find(&pAVar1->Positions,pos);
      if (cVar5._M_current !=
          (pAVar1->Positions).
          super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
          .
          super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&(cVar5._M_current)->second,this,pos,arg);
        return;
      }
    }
    if ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->UnparsedArguments
        != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 this->UnparsedArguments,&local_40);
    }
  }
  else {
    CVar3 = std::
            function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()(&this->KeywordValueFunc,arg);
    if (CVar3 == No) {
      std::
      function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
      operator=(&this->KeywordValueFunc,(nullptr_t)0x0);
    }
    this->KeywordValuesSeen = this->KeywordValuesSeen + 1;
  }
  return;
}

Assistant:

void Instance::Consume(std::size_t pos, cm::string_view arg)
{
  auto const it = this->Bindings.Keywords.Find(arg);
  if (it != this->Bindings.Keywords.end()) {
    this->FinishKeyword();
    this->Keyword = it->first;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    if (this->Bindings.ParsedKeyword) {
      this->Bindings.ParsedKeyword(*this, it->first);
    }
    it->second(*this);
    return;
  }

  if (this->KeywordValueFunc) {
    switch (this->KeywordValueFunc(arg)) {
      case Continue::Yes:
        break;
      case Continue::No:
        this->KeywordValueFunc = nullptr;
        break;
    }
    ++this->KeywordValuesSeen;
    return;
  }

  if (!this->DoneWithPositional) {
    auto const pit = this->Bindings.Positions.Find(pos);
    if (pit != this->Bindings.Positions.end()) {
      pit->second(*this, pos, arg);
      return;
    }
  }

  if (this->UnparsedArguments != nullptr) {
    this->UnparsedArguments->emplace_back(arg);
  }
}